

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

optional<unsigned_long> __thiscall
tsbp::TwoStepBranchingProcedure::Backtrack(TwoStepBranchingProcedure *this,size_t currentNode)

{
  unsigned_long uVar1;
  bool bVar2;
  reference puVar3;
  vertex_bundled *pvVar4;
  size_type sVar5;
  degree_size_type dVar6;
  ostream *poVar7;
  reference __t;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar8;
  optional<unsigned_long> oVar9;
  size_t outDegree;
  Node *nodeToDeactivate;
  _Node_iterator_base<unsigned_long,_false> _Stack_80;
  int nodeIdToDeactivate;
  iterator __end1;
  iterator __begin1;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60;
  const_iterator local_58;
  TwoStepBranchingProcedure *local_50;
  unsigned_long *local_48;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_40;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38;
  const_iterator local_30;
  size_t local_28;
  size_t currentNode_local;
  TwoStepBranchingProcedure *this_local;
  bool local_10;
  
  local_28 = currentNode;
  currentNode_local = (size_t)this;
  CheckMemoryUsage();
  bVar2 = std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::empty(&this->nodesToDeactivate);
  if (!bVar2) {
    local_40._M_current =
         (unsigned_long *)
         std::begin<std::vector<unsigned_long,std::allocator<unsigned_long>>>(&this->activeNodes);
    local_48 = (unsigned_long *)
               std::end<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                         (&this->activeNodes);
    local_50 = this;
    local_38 = std::
               remove_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::__0>
                         (local_40,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    )local_48,(anon_class_8_1_8991fb9c_for__M_pred)this);
    __gnu_cxx::
    __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
    ::__normal_iterator<unsigned_long*>
              ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                *)&local_30,&local_38);
    local_60._M_current =
         (unsigned_long *)
         std::end<std::vector<unsigned_long,std::allocator<unsigned_long>>>(&this->activeNodes);
    __gnu_cxx::
    __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
    ::__normal_iterator<unsigned_long*>
              ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                *)&local_58,&local_60);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
              (&this->activeNodes,local_30,local_58);
  }
  __end1 = std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::begin(&this->nodesToDeactivate);
  _Stack_80._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
       ::end(&this->nodesToDeactivate);
  while (bVar2 = std::__detail::operator==
                           (&__end1.super__Node_iterator_base<unsigned_long,_false>,
                            &stack0xffffffffffffff80), ((bVar2 ^ 0xffU) & 1) != 0) {
    puVar3 = std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*(&__end1);
    uVar1 = *puVar3;
    pvVar4 = boost::
             adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>
             ::operator[](&this->tree,(long)(int)uVar1);
    if ((long)(int)uVar1 != this->maxPlacedItemsInfeasibleNodeId) {
      std::unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>::reset
                (&pvVar4->Packing,(pointer)0x0);
    }
    std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++(&__end1);
  }
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::clear(&this->nodesToDeactivate);
  std::
  unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
  ::emplace<unsigned_long&>
            ((unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
              *)&this->nodesToDeactivate,&this->maxPlacedItemsInfeasibleNodeId);
  sVar5 = CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->activeNodes);
  if (sVar5 == 0) {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
    uVar8 = extraout_RDX;
  }
  else {
    sVar5 = std::
            vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
            ::size(&(this->tree).super_type.m_vertices);
    if (this->exploredNodeDisplayInterval < (int)sVar5 - (int)this->exploredNodeDisplayCount) {
      sVar5 = std::
              vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
              ::size(&(this->tree).super_type.m_vertices);
      this->exploredNodeDisplayCount = sVar5;
      dVar6 = boost::
              out_degree<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>::config>>
                        (0,(adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
                            *)&this->tree);
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "TSBP \t Explored / root outedges / active nodes: ");
      sVar5 = std::
              vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
              ::size(&(this->tree).super_type.m_vertices);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar5);
      poVar7 = std::operator<<(poVar7," / ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar6);
      poVar7 = std::operator<<(poVar7," / ");
      sVar5 = CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        (&this->activeNodes);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar5);
      std::operator<<(poVar7,"\n");
    }
    __t = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->activeNodes);
    std::optional<unsigned_long>::optional<unsigned_long_&,_true>
              ((optional<unsigned_long> *)&this_local,__t);
    uVar8 = extraout_RDX_00;
  }
  oVar9.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar8 >> 8);
  oVar9.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = local_10;
  oVar9.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload = (_Storage<unsigned_long,_true>)this_local
  ;
  return (optional<unsigned_long>)
         oVar9.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> TwoStepBranchingProcedure::Backtrack(size_t currentNode)
{
    // Check here instead of IsCancelled() to avoid excessive number of memory checks.
    // According to https://stackoverflow.com/a/64166/5587903.
    CheckMemoryUsage();

    // Remove deactivated leaves.
    if (!this->nodesToDeactivate.empty())
    {
        // Delete ordersToRemove from orders according to https://en.wikipedia.org/wiki/Erase%E2%80%93remove_idiom
        this->activeNodes.erase(
            std::remove_if(
                std::begin(this->activeNodes),
                std::end(this->activeNodes),
                [&](size_t nodeToRemove)
                {
                    return this->nodesToDeactivate.contains(nodeToRemove);
                }),
            std::end(this->activeNodes));
    }

    // Clear memory from nodes that will never be used again (fathomed/pruned? What's the terminology here?).
    for (int nodeIdToDeactivate: this->nodesToDeactivate)
    {
        Node& nodeToDeactivate = this->tree[nodeIdToDeactivate];

        if (nodeIdToDeactivate == this->maxPlacedItemsInfeasibleNodeId)
        {
            continue;
        }

        nodeToDeactivate.Packing.reset();
    }

    // TODO.Performance: is this the most efficient way to clear the set?
    ////this->nodesToDeactivate = std::unordered_set<size_t>{ this->maxPlacedItemsInfeasibleNodeId };
    this->nodesToDeactivate.clear();
    this->nodesToDeactivate.emplace(this->maxPlacedItemsInfeasibleNodeId);

    if (this->activeNodes.size() == 0)
    {
        return std::nullopt;
    }

    if ((int)this->tree.m_vertices.size() - (int)this->exploredNodeDisplayCount > (int)this->exploredNodeDisplayInterval)
    {
        this->exploredNodeDisplayCount = this->tree.m_vertices.size();
        size_t outDegree = boost::out_degree(0, this->tree);

        std::cout << "TSBP \t Explored / root outedges / active nodes: " << this->tree.m_vertices.size() << " / " << outDegree << " / " << this->activeNodes.size() << "\n";
    }

    // Backtrack
    return this->activeNodes.back();
}